

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

bool __thiscall
GenericTransactionSignatureChecker<CTransaction>::CheckLockTime
          (GenericTransactionSignatureChecker<CTransaction> *this,CScriptNum *nLockTime)

{
  uint uVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  bool bVar3;
  
  uVar1 = this->txTo->nLockTime;
  uVar2 = (ulong)uVar1;
  if ((uVar2 < 500000000) && (nLockTime->m_value < 500000000)) {
    if (nLockTime->m_value <= (long)uVar2) {
LAB_00423ee1:
      bVar3 = (this->txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start[this->nIn].nSequence != 0xffffffff;
      goto LAB_00423ef7;
    }
  }
  else if (499999999 < uVar1) {
    bVar3 = false;
    if ((nLockTime->m_value < 500000000) || ((long)uVar2 < nLockTime->m_value)) goto LAB_00423ef7;
    goto LAB_00423ee1;
  }
  bVar3 = false;
LAB_00423ef7:
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool GenericTransactionSignatureChecker<T>::CheckLockTime(const CScriptNum& nLockTime) const
{
    // There are two kinds of nLockTime: lock-by-blockheight
    // and lock-by-blocktime, distinguished by whether
    // nLockTime < LOCKTIME_THRESHOLD.
    //
    // We want to compare apples to apples, so fail the script
    // unless the type of nLockTime being tested is the same as
    // the nLockTime in the transaction.
    if (!(
        (txTo->nLockTime <  LOCKTIME_THRESHOLD && nLockTime <  LOCKTIME_THRESHOLD) ||
        (txTo->nLockTime >= LOCKTIME_THRESHOLD && nLockTime >= LOCKTIME_THRESHOLD)
    ))
        return false;

    // Now that we know we're comparing apples-to-apples, the
    // comparison is a simple numeric one.
    if (nLockTime > (int64_t)txTo->nLockTime)
        return false;

    // Finally the nLockTime feature can be disabled in IsFinalTx()
    // and thus CHECKLOCKTIMEVERIFY bypassed if every txin has
    // been finalized by setting nSequence to maxint. The
    // transaction would be allowed into the blockchain, making
    // the opcode ineffective.
    //
    // Testing if this vin is not final is sufficient to
    // prevent this condition. Alternatively we could test all
    // inputs, but testing just this input minimizes the data
    // required to prove correct CHECKLOCKTIMEVERIFY execution.
    if (CTxIn::SEQUENCE_FINAL == txTo->vin[nIn].nSequence)
        return false;

    return true;
}